

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriParse.c
# Opt level: O2

UriBool uriOnExitOwnHost2W(UriParserStateW *state,wchar_t *first,UriMemoryManager *memory)

{
  UriUriW *pUVar1;
  wchar_t wVar2;
  UriIp4 *octetOutput;
  UriBool UVar3;
  
  (state->uri->hostText).afterLast = first;
  octetOutput = (UriIp4 *)(*memory->malloc)(memory,4);
  pUVar1 = state->uri;
  (pUVar1->hostData).ip4 = octetOutput;
  if (octetOutput == (UriIp4 *)0x0) {
    UVar3 = 0;
  }
  else {
    wVar2 = uriParseIpFourAddressW
                      ((uchar *)octetOutput,(pUVar1->hostText).first,(pUVar1->hostText).afterLast);
    UVar3 = 1;
    if (wVar2 != L'\0') {
      (*memory->free)(memory,(state->uri->hostData).ip4);
      (state->uri->hostData).ip4 = (UriIp4 *)0x0;
    }
  }
  return UVar3;
}

Assistant:

static URI_INLINE UriBool URI_FUNC(OnExitOwnHost2)(
		URI_TYPE(ParserState) * state, const URI_CHAR * first,
		UriMemoryManager * memory) {
	state->uri->hostText.afterLast = first; /* HOST END */

	/* Valid IPv4 or just a regname? */
	state->uri->hostData.ip4 = memory->malloc(memory, 1 * sizeof(UriIp4)); /* Freed when stopping on parse error */
	if (state->uri->hostData.ip4 == NULL) {
		return URI_FALSE; /* Raises malloc error */
	}
	if (URI_FUNC(ParseIpFourAddress)(state->uri->hostData.ip4->data,
			state->uri->hostText.first, state->uri->hostText.afterLast)) {
		/* Not IPv4 */
		memory->free(memory, state->uri->hostData.ip4);
		state->uri->hostData.ip4 = NULL;
	}
	return URI_TRUE; /* Success */
}